

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.cc
# Opt level: O3

bool __thiscall sptk::Matrix::Transpose(Matrix *this,Matrix *transposed_matrix)

{
  uint uVar1;
  pointer ppdVar2;
  double *pdVar3;
  int num_column;
  bool bVar4;
  ulong uVar5;
  uint uVar6;
  ulong uVar7;
  
  bVar4 = this != transposed_matrix && transposed_matrix != (Matrix *)0x0;
  if (this == transposed_matrix || transposed_matrix == (Matrix *)0x0) {
    return bVar4;
  }
  uVar6 = transposed_matrix->num_row_;
  if (uVar6 == this->num_column_) {
    num_column = this->num_row_;
    if (transposed_matrix->num_column_ == num_column) goto LAB_00108ec6;
  }
  else {
    num_column = this->num_row_;
  }
  Resize(transposed_matrix,this->num_column_,num_column);
  uVar6 = this->num_column_;
LAB_00108ec6:
  if (0 < (int)uVar6) {
    uVar1 = this->num_row_;
    ppdVar2 = (this->index_).super__Vector_base<double_*,_std::allocator<double_*>_>._M_impl.
              super__Vector_impl_data._M_start;
    uVar5 = 0;
    do {
      if (0 < (int)uVar1) {
        pdVar3 = (transposed_matrix->index_).super__Vector_base<double_*,_std::allocator<double_*>_>
                 ._M_impl.super__Vector_impl_data._M_start[uVar5];
        uVar7 = 0;
        do {
          pdVar3[uVar7] = ppdVar2[uVar7][uVar5];
          uVar7 = uVar7 + 1;
        } while (uVar1 != uVar7);
      }
      uVar5 = uVar5 + 1;
    } while (uVar5 != uVar6);
  }
  return bVar4;
}

Assistant:

bool Matrix::Transpose(Matrix* transposed_matrix) const {
  if (NULL == transposed_matrix || this == transposed_matrix) {
    return false;
  }

  if (transposed_matrix->num_row_ != num_column_ ||
      transposed_matrix->num_column_ != num_row_) {
    transposed_matrix->Resize(num_column_, num_row_);
  }

  for (int i(0); i < num_column_; ++i) {
    for (int j(0); j < num_row_; ++j) {
      transposed_matrix->index_[i][j] = index_[j][i];
    }
  }

  return true;
}